

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtEqual(word *pIn1,word *pIn2,int nWords)

{
  int local_28;
  int w;
  int nWords_local;
  word *pIn2_local;
  word *pIn1_local;
  
  local_28 = 0;
  while( true ) {
    if (nWords <= local_28) {
      return 1;
    }
    if (pIn1[local_28] != pIn2[local_28]) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

static inline int Abc_TtEqual( word * pIn1, word * pIn2, int nWords )
{
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] != pIn2[w] )
            return 0;
    return 1;
}